

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_schedule_tblink(Terminal *term)

{
  unsigned_long uVar1;
  Terminal *term_local;
  
  if ((term->blink_is_real & 1U) == 0) {
    term->tblinker = true;
    term->tblink_pending = false;
  }
  else {
    if ((term->tblink_pending & 1U) == 0) {
      uVar1 = schedule_timer(0x1c2,term_timer,term);
      term->next_tblink = uVar1;
    }
    term->tblink_pending = true;
  }
  return;
}

Assistant:

static void term_schedule_tblink(Terminal *term)
{
    if (term->blink_is_real) {
        if (!term->tblink_pending)
            term->next_tblink = schedule_timer(TBLINK_DELAY, term_timer, term);
        term->tblink_pending = true;
    } else {
        term->tblinker = true;         /* reset when not in use */
        term->tblink_pending = false;
    }
}